

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

void __thiscall
duckdb::Expression::Expression
          (Expression *this,ExpressionType type,ExpressionClass expression_class,
          LogicalType *return_type)

{
  LogicalType *in_RCX;
  LogicalType *in_RDI;
  BaseExpression *unaff_retaddr;
  
  BaseExpression::BaseExpression
            (unaff_retaddr,(ExpressionType)((ulong)in_RDI >> 0x38),
             (ExpressionClass)((ulong)in_RDI >> 0x30));
  *(undefined ***)in_RDI = &PTR__Expression_03519368;
  LogicalType::LogicalType(in_RDI,in_RCX);
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::unique_ptr
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)0xe6fb78);
  return;
}

Assistant:

Expression::Expression(ExpressionType type, ExpressionClass expression_class, LogicalType return_type)
    : BaseExpression(type, expression_class), return_type(std::move(return_type)) {
}